

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O3

int quantize_segment_mix(mixed_segment *segment)

{
  undefined8 *puVar1;
  mixed_buffer *buffer;
  mixed_buffer *buffer_00;
  float fVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  float fVar17;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 in_ZMM10 [64];
  undefined1 auVar18 [64];
  uint32_t samples;
  float *in;
  uint32_t local_4c;
  float *local_48;
  float *local_40;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  auVar13 = in_ZMM7._0_32_;
  puVar1 = (undefined8 *)segment->data;
  local_28 = ZEXT416(*(uint *)(puVar1 + 2));
  local_38 = ZEXT416(*(uint *)((long)puVar1 + 0x14));
  local_4c = 0xffffffff;
  buffer = (mixed_buffer *)*puVar1;
  buffer_00 = (mixed_buffer *)puVar1[1];
  mixed_buffer_request_read(&local_48,&local_4c,buffer);
  if (buffer == buffer_00) {
    uVar6 = (ulong)local_4c;
    if (uVar6 != 0) {
      fVar2 = 1.0 - (float)local_38._0_4_;
      lVar7 = uVar6 - 1;
      auVar12._8_8_ = lVar7;
      auVar12._0_8_ = lVar7;
      auVar12._16_8_ = lVar7;
      auVar12._24_8_ = lVar7;
      auVar9._4_4_ = local_28._0_4_;
      auVar9._0_4_ = local_28._0_4_;
      auVar9._8_4_ = local_28._0_4_;
      auVar9._12_4_ = local_28._0_4_;
      auVar9._16_4_ = local_28._0_4_;
      auVar9._20_4_ = local_28._0_4_;
      auVar9._24_4_ = local_28._0_4_;
      auVar9._28_4_ = local_28._0_4_;
      uVar8 = 0;
      auVar3 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar4 = vpmovsxbq_avx2(ZEXT416(0x7060504));
      auVar11._8_8_ = 0x8000000000000000;
      auVar11._0_8_ = 0x8000000000000000;
      auVar11._16_8_ = 0x8000000000000000;
      auVar11._24_8_ = 0x8000000000000000;
      auVar13 = vpcmpeqd_avx2(auVar13,auVar13);
      do {
        auVar14._8_8_ = uVar8;
        auVar14._0_8_ = uVar8;
        auVar14._16_8_ = uVar8;
        auVar14._24_8_ = uVar8;
        auVar5 = vpor_avx2(auVar14,auVar3);
        auVar14 = vpor_avx2(auVar14,auVar4);
        auVar14 = vpcmpgtq_avx2(auVar14 ^ auVar11,auVar12 ^ auVar11);
        auVar5 = vpcmpgtq_avx2(auVar5 ^ auVar11,auVar12 ^ auVar11);
        auVar14 = vpackssdw_avx2(auVar5,auVar14);
        auVar10 = vpackssdw_avx(SUB3216(auVar14 ^ auVar13,0),SUB3216(auVar14 ^ auVar13,0x10));
        auVar10 = vpshufd_avx(auVar10,0xd8);
        auVar14 = vpmovzxwd_avx2(auVar10);
        auVar15 = vpslld_avx2(auVar14,0x1f);
        auVar5 = vmaskmovps_avx(auVar15,*(undefined1 (*) [32])(local_48 + uVar8));
        auVar18._0_4_ = auVar5._0_4_ * (float)local_28._0_4_;
        auVar18._4_4_ = auVar5._4_4_ * (float)local_28._0_4_;
        auVar18._8_4_ = auVar5._8_4_ * (float)local_28._0_4_;
        auVar18._12_4_ = auVar5._12_4_ * (float)local_28._0_4_;
        auVar18._16_4_ = auVar5._16_4_ * (float)local_28._0_4_;
        auVar18._20_4_ = auVar5._20_4_ * (float)local_28._0_4_;
        auVar18._28_36_ = in_ZMM10._28_36_;
        auVar18._24_4_ = auVar5._24_4_ * (float)local_28._0_4_;
        auVar14 = vroundps_avx(auVar18._0_32_,9);
        auVar14 = vdivps_avx(auVar14,auVar9);
        fVar17 = auVar14._0_4_ * (float)local_38._0_4_;
        fVar19 = auVar14._4_4_ * (float)local_38._0_4_;
        fVar20 = auVar14._8_4_ * (float)local_38._0_4_;
        fVar21 = auVar14._12_4_ * (float)local_38._0_4_;
        fVar22 = auVar14._16_4_ * (float)local_38._0_4_;
        fVar23 = auVar14._20_4_ * (float)local_38._0_4_;
        fVar24 = auVar14._24_4_ * (float)local_38._0_4_;
        in_ZMM10 = ZEXT3264(CONCAT428(auVar14._28_4_,
                                      CONCAT424(fVar24,CONCAT420(fVar23,CONCAT416(fVar22,CONCAT412(
                                                  fVar21,CONCAT48(fVar20,CONCAT44(fVar19,fVar17)))))
                                               )));
        auVar16._0_4_ = auVar5._0_4_ * fVar2 + fVar17;
        auVar16._4_4_ = auVar5._4_4_ * fVar2 + fVar19;
        auVar16._8_4_ = auVar5._8_4_ * fVar2 + fVar20;
        auVar16._12_4_ = auVar5._12_4_ * fVar2 + fVar21;
        auVar16._16_4_ = auVar5._16_4_ * fVar2 + fVar22;
        auVar16._20_4_ = auVar5._20_4_ * fVar2 + fVar23;
        auVar16._24_4_ = auVar5._24_4_ * fVar2 + fVar24;
        auVar16._28_4_ = auVar5._28_4_ + auVar14._28_4_;
        auVar14 = vmaskmovps_avx(auVar15,auVar16);
        *(undefined1 (*) [32])(local_48 + uVar8) = auVar14;
        uVar8 = uVar8 + 8;
      } while ((uVar6 + 7 & 0xfffffffffffffff8) != uVar8);
    }
  }
  else {
    mixed_buffer_request_write(&local_40,&local_4c,buffer_00);
    if ((ulong)local_4c != 0) {
      uVar6 = 0;
      do {
        auVar10 = ZEXT416((uint)((float)local_28._0_4_ * local_48[uVar6]));
        auVar10 = vroundss_avx(auVar10,auVar10,9);
        local_40[uVar6] =
             local_48[uVar6] * (1.0 - (float)local_38._0_4_) +
             (float)local_38._0_4_ * (auVar10._0_4_ / (float)local_28._0_4_);
        uVar6 = uVar6 + 1;
      } while (local_4c != uVar6);
    }
    mixed_buffer_finish_read(local_4c,buffer);
    mixed_buffer_finish_write(local_4c,buffer_00);
  }
  return 1;
}

Assistant:

VECTORIZE int quantize_segment_mix(struct mixed_segment *segment){
  struct quantize_segment_data *data = (struct quantize_segment_data *)segment->data;

  float steps = data->steps;
  float mix = data->mix;
  with_mixed_buffer_transfer(i, samples, in, data->in, out, data->out, {
      float s = in[i];
      float o = floor(s * steps) / steps;
      out[i] = LERP(s, o, mix);
    });
  return 1;
}